

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

RtMidiApi rtmidi_compiled_api_by_name(char *name)

{
  allocator<char> local_39;
  string local_38;
  RtMidiApi local_14;
  char *pcStack_10;
  Api api;
  char *name_local;
  
  local_14 = RTMIDI_API_UNSPECIFIED;
  if (name != (char *)0x0) {
    pcStack_10 = name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    local_14 = RtMidi::getCompiledApiByName(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return local_14;
}

Assistant:

enum RtMidiApi rtmidi_compiled_api_by_name(const char *name) {
    RtMidi::Api api = RtMidi::UNSPECIFIED;
    if (name) {
        api = RtMidi::getCompiledApiByName(name);
    }
    return (enum RtMidiApi)api;
}